

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_draw_list_path_arc_to_fast
               (nk_draw_list *list,nk_vec2 center,float radius,int a_min,int a_max)

{
  undefined1 auVar1 [16];
  nk_vec2 pos;
  long lVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  
  if (list != (nk_draw_list *)0x0) {
    if (a_min <= a_max) {
      uVar5 = (ulong)a_min;
      lVar4 = uVar5 * 8 + 0x10;
      iVar3 = (a_max - a_min) + 1;
      do {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar5;
        lVar2 = lVar4 + (SUB168(auVar1 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0x3ffffffffffffff8) * -0xc
        ;
        pos.y = *(float *)((long)list + lVar2 + 4) * radius + center.y;
        pos.x = *(float *)((long)list + lVar2) * radius + center.x;
        nk_draw_list_path_line_to(list,pos);
        uVar5 = uVar5 + 1;
        lVar4 = lVar4 + 8;
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
    return;
  }
  __assert_fail("list",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                ,0x2723,
                "void nk_draw_list_path_arc_to_fast(struct nk_draw_list *, struct nk_vec2, float, int, int)"
               );
}

Assistant:

NK_API void
nk_draw_list_path_arc_to_fast(struct nk_draw_list *list, struct nk_vec2 center,
    float radius, int a_min, int a_max)
{
    int a = 0;
    NK_ASSERT(list);
    if (!list) return;
    if (a_min <= a_max) {
        for (a = a_min; a <= a_max; a++) {
            const struct nk_vec2 c = list->circle_vtx[(nk_size)a % NK_LEN(list->circle_vtx)];
            const float x = center.x + c.x * radius;
            const float y = center.y + c.y * radius;
            nk_draw_list_path_line_to(list, nk_vec2(x, y));
        }
    }
}